

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop_x86.cpp
# Opt level: O0

int __thiscall
ncnn::Crop_x86::forward
          (Crop_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int *piVar1;
  const_reference pvVar2;
  reference pvVar3;
  undefined8 *in_RCX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long *in_RDI;
  bool bVar4;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blobs_unpacked;
  Option opt_pack1_1;
  Mat reference_blob_unpacked;
  Option opt_pack1;
  Mat bottom_blob_unpacked;
  Mat borderm_1;
  Mat m_5;
  int z;
  int q_1;
  Mat bottom_blob_sliced_1;
  size_t out_elemsize_3;
  int out_elempack_3;
  Mat borderm;
  Mat m_1;
  int q;
  Mat bottom_blob_sliced;
  size_t out_elemsize_2;
  int out_elempack_2;
  size_t out_elemsize_1;
  int out_elempack_1;
  size_t out_elemsize;
  int out_elempack;
  int _outc;
  int _outd;
  int _outh;
  int _outw;
  int _coffset;
  int _doffset;
  int _hoffset;
  int _woffset;
  Mat *top_blob;
  int ref_elempack;
  int elempack;
  size_t elemsize;
  int dims;
  int channels;
  int d;
  int h;
  int w;
  Mat *reference_blob;
  Mat *bottom_blob;
  Mat *m_4;
  Mat *m;
  Mat *m_6;
  Mat *m_2;
  Mat *m_7;
  Mat *m_3;
  int *piVar5;
  allocator_type *in_stack_ffffffffffffea20;
  int *in_stack_ffffffffffffea28;
  undefined4 in_stack_ffffffffffffea30;
  int in_stack_ffffffffffffea34;
  int in_stack_ffffffffffffea38;
  int in_stack_ffffffffffffea3c;
  undefined4 in_stack_ffffffffffffea40;
  int in_stack_ffffffffffffea44;
  Mat *in_stack_ffffffffffffea48;
  value_type *pvVar6;
  Mat *in_stack_ffffffffffffea50;
  int in_stack_ffffffffffffea90;
  Allocator *in_stack_ffffffffffffea98;
  Allocator *in_stack_ffffffffffffeaa0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_1240;
  undefined8 local_1228;
  undefined8 uStack_1220;
  undefined8 local_1218;
  undefined8 uStack_1210;
  undefined8 local_1208;
  undefined8 uStack_1200;
  undefined8 local_11f8;
  undefined8 uStack_11f0;
  value_type local_11e0;
  undefined8 local_1198;
  undefined8 uStack_1190;
  undefined8 local_1188;
  undefined8 uStack_1180;
  undefined8 local_1178;
  undefined8 uStack_1170;
  undefined8 local_1168;
  undefined8 uStack_1160;
  value_type local_1158;
  undefined8 local_1110;
  undefined8 local_1108;
  undefined8 local_1100;
  undefined4 local_10f8;
  Allocator *local_10f0;
  undefined4 local_10e8;
  undefined4 local_10e4;
  undefined4 local_10e0;
  undefined4 local_10dc;
  undefined4 local_10d8;
  undefined8 local_10d0;
  Mat local_10c8;
  undefined8 local_1080;
  undefined8 local_1078;
  undefined8 local_1070;
  undefined4 local_1068;
  Allocator *local_1060;
  undefined4 local_1058;
  undefined4 local_1054;
  undefined4 local_1050;
  undefined4 local_104c;
  undefined4 local_1048;
  undefined8 local_1040;
  Mat local_1038;
  int local_ff0;
  int local_fec;
  Mat local_fe8;
  void *local_fa0;
  int *local_f98;
  ulong local_f90;
  int local_f88;
  Allocator *local_f80;
  int local_f78;
  int local_f74;
  int local_f70;
  uint local_f6c;
  int local_f68;
  ulong local_f60;
  long local_f58;
  int local_f4c;
  Mat local_f48;
  void *local_f00;
  int *local_ef8;
  size_t local_ef0;
  int local_ee8;
  Allocator *local_ee0;
  int local_ed8;
  int local_ed4;
  int local_ed0;
  int local_ecc;
  uint local_ec8;
  Option *in_stack_fffffffffffff140;
  undefined4 in_stack_fffffffffffff148;
  int iVar7;
  undefined4 in_stack_fffffffffffff14c;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_fffffffffffff150;
  Crop *in_stack_fffffffffffff158;
  Allocator *local_e90;
  void *local_e68;
  int *local_e60;
  ulong local_e58;
  int local_e50;
  Allocator *local_e48;
  int local_e40;
  int local_e3c;
  int local_e38;
  uint local_e34;
  int local_e30;
  ulong local_e28;
  long local_e20;
  int local_e14;
  long local_e10;
  int local_e04;
  long local_e00;
  int local_df4;
  Mat local_df0;
  Mat local_da8;
  Mat local_d50;
  int local_d08;
  int local_d04;
  int local_d00;
  int local_cfc;
  int local_cf8;
  int local_cf4;
  int local_cf0;
  int local_cec;
  const_reference local_ce8;
  int local_ce0;
  int local_cdc;
  size_t local_cd8;
  int local_ccc;
  int local_cc8;
  int local_cc4;
  int local_cc0;
  int local_cbc;
  const_reference local_cb8;
  const_reference local_cb0;
  undefined8 *local_ca8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_ca0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_c98;
  int local_c84;
  const_reference local_c80;
  Mat *local_c78;
  const_reference local_c70;
  Mat *local_c68;
  const_reference local_c60;
  Mat *local_c58;
  Mat *local_c50;
  Mat *local_c40;
  Mat *local_c30;
  undefined1 *local_c20;
  Mat *local_c10;
  void **local_c00;
  void **local_bf0;
  Mat *local_be0;
  undefined8 *local_bd0;
  undefined8 *local_bc0;
  Mat *local_bb0;
  Mat *local_ba0;
  void **local_b90;
  value_type *local_b80;
  value_type *local_b70;
  int local_b60;
  undefined4 local_b5c;
  reference local_b58;
  reference local_b50;
  reference local_b48;
  int local_b40;
  undefined4 local_b3c;
  reference local_b38;
  reference local_b30;
  reference local_b28;
  int local_b20;
  undefined4 local_b1c;
  const_reference local_b18;
  const_reference local_b10;
  const_reference local_b08;
  int local_b00;
  undefined4 local_afc;
  const_reference local_af8;
  const_reference local_af0;
  undefined4 local_ae0;
  undefined4 local_adc;
  const_reference local_ad8;
  const_reference local_ad0;
  const_reference local_ac8;
  int local_ac0;
  undefined4 local_abc;
  const_reference local_ab8;
  const_reference local_ab0;
  int local_aa0;
  undefined4 local_a9c;
  const_reference local_a98;
  const_reference local_a90;
  int local_a80;
  undefined4 local_a7c;
  const_reference local_a78;
  const_reference local_a70;
  const_reference local_a60;
  const_reference local_a58;
  const_reference local_a50;
  const_reference local_a48;
  Mat *local_a40;
  Mat *local_a38;
  undefined1 local_a29;
  int local_a28;
  int local_a24;
  const_reference local_a20;
  void **local_a18;
  undefined1 local_a01;
  int local_a00;
  int local_9fc;
  const_reference local_9f8;
  void **local_9f0;
  undefined1 local_9dd;
  int local_9dc;
  void **local_9d8;
  undefined8 *local_9d0;
  undefined1 local_9bd;
  int local_9bc;
  void **local_9b8;
  void **local_9b0;
  undefined1 local_99d;
  int local_99c;
  const_reference local_998;
  undefined8 *local_990;
  undefined1 local_97d;
  int local_97c;
  const_reference local_978;
  Mat *local_970;
  int local_95c;
  undefined8 *local_958;
  Mat *local_950;
  int local_944;
  undefined8 *local_940;
  Mat *local_938;
  const_reference local_930;
  value_type *local_928;
  const_reference local_920;
  value_type *local_918;
  const_reference local_910;
  undefined8 local_908;
  undefined8 local_900;
  undefined8 local_8f8;
  int local_8ec;
  Mat *local_8e8;
  undefined8 local_8e0;
  undefined8 local_8d8;
  undefined8 local_8d0;
  int local_8c4;
  Mat *local_8c0;
  undefined8 local_8b8;
  undefined8 local_8b0;
  undefined8 local_8a8;
  int local_89c;
  Mat *local_898;
  undefined8 local_890;
  undefined8 local_888;
  undefined8 local_880;
  int local_878;
  int local_874;
  Mat *local_870;
  undefined8 local_868;
  undefined8 local_860;
  undefined8 local_858;
  int local_850;
  int local_84c;
  Mat *local_848;
  undefined8 local_840;
  undefined8 local_838;
  undefined8 local_830;
  int local_828;
  int local_824;
  Mat *local_820;
  undefined8 local_818;
  undefined8 local_810;
  undefined8 local_808;
  int local_7fc;
  int local_7f8;
  int local_7f4;
  Mat *local_7f0;
  undefined8 local_7e8;
  undefined8 local_7e0;
  undefined8 local_7d8;
  int local_7cc;
  int local_7c8;
  int local_7c4;
  Mat *local_7c0;
  undefined8 local_7b8;
  undefined8 local_7b0;
  undefined8 local_7a8;
  int local_79c;
  int local_798;
  int local_794;
  Mat *local_790;
  undefined8 local_788;
  undefined8 local_780;
  undefined8 local_778;
  int local_770;
  int local_76c;
  int local_768;
  int local_764;
  Mat *local_760;
  undefined8 local_758;
  undefined8 local_750;
  undefined8 local_748;
  int local_740;
  int local_73c;
  int local_738;
  int local_734;
  Mat *local_730;
  undefined8 local_728;
  undefined8 local_720;
  undefined8 local_718;
  int local_710;
  int local_70c;
  int local_708;
  int local_704;
  Mat *local_700;
  Mat *local_6f8;
  Mat *local_6f0;
  Mat *local_6e8;
  undefined4 local_6dc;
  long local_6d8;
  undefined4 local_6cc;
  long local_6c8;
  undefined4 local_6bc;
  long local_6b8;
  undefined4 local_6ac;
  long local_6a8;
  undefined4 local_69c;
  long local_698;
  undefined4 local_68c;
  long local_688;
  int local_620;
  undefined4 local_61c;
  const_reference local_618;
  int local_610;
  undefined4 local_60c;
  const_reference local_608;
  int local_600;
  undefined4 local_5fc;
  const_reference local_5f8;
  int local_5f0;
  undefined4 local_5ec;
  const_reference local_5e8;
  int local_5e0;
  undefined4 local_5dc;
  const_reference local_5d8;
  int local_5d0;
  undefined4 local_5cc;
  const_reference local_5c8;
  int local_5c0;
  undefined4 local_5bc;
  reference local_5b8;
  int local_5b0;
  undefined4 local_5ac;
  reference local_5a8;
  int local_590;
  undefined4 local_58c;
  value_type *local_588;
  int local_570;
  undefined4 local_56c;
  value_type *local_568;
  int local_550;
  undefined4 local_54c;
  void **local_548;
  int local_530;
  undefined4 local_52c;
  Mat *local_528;
  int local_510;
  undefined4 local_50c;
  Mat *local_508;
  undefined8 *local_4e8;
  undefined8 *local_4c8;
  int local_4b0;
  undefined4 local_4ac;
  Mat *local_4a8;
  int local_490;
  undefined4 local_48c;
  void **local_488;
  int local_470;
  undefined4 local_46c;
  void **local_468;
  int local_450;
  undefined4 local_44c;
  Mat *local_448;
  int local_430;
  undefined4 local_42c;
  undefined1 *local_428;
  int local_410;
  undefined4 local_40c;
  Mat *local_408;
  int local_3f0;
  undefined4 local_3ec;
  Mat *local_3e8;
  int local_3d0;
  undefined4 local_3cc;
  Mat *local_3c8;
  void *local_3c0;
  void *local_3b0;
  void *local_3a0;
  void *local_380;
  void *local_370;
  void *local_360;
  void *local_320;
  void *local_310;
  void *local_300;
  void *local_2f0;
  void *local_2e0;
  void *local_2d0;
  void *local_2c8;
  void *local_2c0;
  void *local_2b8;
  void *local_2b0;
  void *local_2a8;
  void *local_2a0;
  void *local_298;
  Mat *local_260;
  Mat *local_258;
  const_reference local_250;
  const_reference local_248;
  const_reference local_240;
  const_reference local_238;
  Allocator *local_230;
  int local_224;
  ulong local_220;
  void *local_218;
  int local_210;
  uint local_20c;
  int local_208;
  int local_204;
  void **local_200;
  undefined4 local_1f4;
  long local_1f0;
  Allocator *local_1e8;
  int local_1dc;
  ulong local_1d8;
  void *local_1d0;
  int local_1c8;
  uint local_1c4;
  int local_1c0;
  int local_1bc;
  void **local_1b8;
  undefined4 local_1ac;
  long local_1a8;
  Allocator *local_1a0;
  int local_194;
  ulong local_190;
  void *local_188;
  int local_17c;
  int local_178;
  int local_174;
  Mat *local_170;
  undefined4 local_164;
  long local_160;
  Allocator *local_158;
  int local_14c;
  size_t local_148;
  void *local_140;
  int local_134;
  int local_130;
  int local_12c;
  undefined8 *local_128;
  undefined4 local_11c;
  long local_118;
  Allocator *local_110;
  int local_104;
  ulong local_100;
  void *local_f8;
  uint local_ec;
  int local_e8;
  int local_e4;
  void **local_e0;
  undefined4 local_d4;
  long local_d0;
  Allocator *local_c8;
  int local_bc;
  ulong local_b8;
  void *local_b0;
  uint local_a4;
  int local_a0;
  int local_9c;
  undefined8 *local_98;
  undefined4 local_8c;
  long local_88;
  Allocator *local_80;
  int local_74;
  size_t local_70;
  void *local_68;
  int local_60;
  int local_5c;
  Mat *local_58;
  Allocator *local_50;
  int local_44;
  ulong local_40;
  void *local_38;
  int local_30;
  int local_2c;
  Mat *local_28;
  int local_20;
  undefined4 local_1c;
  value_type *local_18;
  int local_10;
  undefined4 local_c;
  value_type *local_8;
  
  local_ca8 = in_RCX;
  local_ca0 = in_RDX;
  local_c98 = in_RSI;
  local_cb0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_cb8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_c98,1);
  local_cbc = local_cb0->w;
  local_cc0 = local_cb0->h;
  local_cc4 = local_cb0->d;
  local_cc8 = local_cb0->c;
  local_ccc = local_cb0->dims;
  local_cd8 = local_cb0->elemsize;
  local_cdc = local_cb0->elempack;
  local_ce0 = local_cb8->elempack;
  local_ce8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_ca0,0);
  if (local_cdc != 4) {
LAB_009f7015:
    local_928 = &local_1158;
    local_930 = local_cb0;
    local_1158.data = local_cb0->data;
    local_1158.refcount = local_cb0->refcount;
    local_1158.elemsize = local_cb0->elemsize;
    local_1158.elempack = local_cb0->elempack;
    local_1158.allocator = local_cb0->allocator;
    local_1158.dims = local_cb0->dims;
    local_1158.w = local_cb0->w;
    local_1158.h = local_cb0->h;
    local_1158.d = local_cb0->d;
    local_1158.c = local_cb0->c;
    local_1158.cstep = local_cb0->cstep;
    if (local_1158.refcount != (int *)0x0) {
      local_c = 1;
      LOCK();
      local_10 = *local_1158.refcount;
      *local_1158.refcount = *local_1158.refcount + 1;
      UNLOCK();
    }
    local_8 = local_928;
    if (local_cdc != 1) {
      local_1198 = *local_ca8;
      local_1188 = local_ca8[2];
      uStack_1180 = local_ca8[3];
      local_1178 = local_ca8[4];
      uStack_1170 = local_ca8[5];
      local_1168 = local_ca8[6];
      uStack_1160 = local_ca8[7];
      uStack_1190 = local_ca8[2];
      convert_packing(in_stack_ffffffffffffea50,in_stack_ffffffffffffea48,in_stack_ffffffffffffea44,
                      (Option *)CONCAT44(in_stack_ffffffffffffea3c,in_stack_ffffffffffffea38));
    }
    local_918 = &local_11e0;
    local_920 = local_cb8;
    local_11e0.data = local_cb8->data;
    local_11e0.refcount = local_cb8->refcount;
    local_11e0.elemsize = local_cb8->elemsize;
    local_11e0.elempack = local_cb8->elempack;
    local_11e0.allocator = local_cb8->allocator;
    local_11e0.dims = local_cb8->dims;
    local_11e0.w = local_cb8->w;
    local_11e0.h = local_cb8->h;
    local_11e0.d = local_cb8->d;
    local_11e0.c = local_cb8->c;
    local_11e0.cstep = local_cb8->cstep;
    if (local_11e0.refcount != (int *)0x0) {
      local_1c = 1;
      LOCK();
      local_20 = *local_11e0.refcount;
      *local_11e0.refcount = *local_11e0.refcount + 1;
      UNLOCK();
    }
    local_18 = local_918;
    if (local_ce0 != 1) {
      local_1228 = *local_ca8;
      local_1218 = local_ca8[2];
      uStack_1210 = local_ca8[3];
      local_1208 = local_ca8[4];
      uStack_1200 = local_ca8[5];
      local_11f8 = local_ca8[6];
      uStack_11f0 = local_ca8[7];
      uStack_1220 = local_ca8[2];
      convert_packing(in_stack_ffffffffffffea50,in_stack_ffffffffffffea48,in_stack_ffffffffffffea44,
                      (Option *)CONCAT44(in_stack_ffffffffffffea3c,in_stack_ffffffffffffea38));
    }
    std::allocator<ncnn::Mat>::allocator((allocator<ncnn::Mat> *)0x9f738d);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
               CONCAT44(in_stack_ffffffffffffea34,in_stack_ffffffffffffea30),
               (size_type)in_stack_ffffffffffffea28,in_stack_ffffffffffffea20);
    std::allocator<ncnn::Mat>::~allocator((allocator<ncnn::Mat> *)0x9f73b3);
    pvVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_1240,0);
    local_b38 = &local_1158;
    local_b30 = pvVar3;
    if (pvVar3 != local_b38) {
      if (local_1158.refcount != (int *)0x0) {
        local_b3c = 1;
        LOCK();
        local_b40 = *local_1158.refcount;
        *local_1158.refcount = *local_1158.refcount + 1;
        UNLOCK();
      }
      local_5b8 = pvVar3;
      if (pvVar3->refcount != (int *)0x0) {
        piVar5 = pvVar3->refcount;
        local_5bc = 0xffffffff;
        LOCK();
        local_5c0 = *piVar5;
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (local_5c0 == 1) {
          if (pvVar3->allocator == (Allocator *)0x0) {
            local_2c8 = pvVar3->data;
            if (local_2c8 != (void *)0x0) {
              free(local_2c8);
            }
          }
          else {
            (*pvVar3->allocator->_vptr_Allocator[3])(pvVar3->allocator,pvVar3->data);
          }
        }
      }
      pvVar3->data = (void *)0x0;
      pvVar3->elemsize = 0;
      pvVar3->elempack = 0;
      pvVar3->dims = 0;
      pvVar3->w = 0;
      pvVar3->h = 0;
      pvVar3->d = 0;
      pvVar3->c = 0;
      pvVar3->cstep = 0;
      pvVar3->refcount = (int *)0x0;
      pvVar3->data = local_b38->data;
      pvVar3->refcount = local_b38->refcount;
      pvVar3->elemsize = local_b38->elemsize;
      pvVar3->elempack = local_b38->elempack;
      pvVar3->allocator = local_b38->allocator;
      pvVar3->dims = local_b38->dims;
      pvVar3->w = local_b38->w;
      pvVar3->h = local_b38->h;
      pvVar3->d = local_b38->d;
      pvVar3->c = local_b38->c;
      pvVar3->cstep = local_b38->cstep;
    }
    local_b28 = pvVar3;
    pvVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_1240,1);
    local_b58 = &local_11e0;
    local_b50 = pvVar3;
    if (pvVar3 != local_b58) {
      if (local_11e0.refcount != (int *)0x0) {
        local_b5c = 1;
        LOCK();
        local_b60 = *local_11e0.refcount;
        *local_11e0.refcount = *local_11e0.refcount + 1;
        UNLOCK();
      }
      local_5a8 = pvVar3;
      if (pvVar3->refcount != (int *)0x0) {
        piVar5 = pvVar3->refcount;
        local_5ac = 0xffffffff;
        LOCK();
        local_5b0 = *piVar5;
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (local_5b0 == 1) {
          if (pvVar3->allocator == (Allocator *)0x0) {
            local_2d0 = pvVar3->data;
            if (local_2d0 != (void *)0x0) {
              free(local_2d0);
            }
          }
          else {
            (*pvVar3->allocator->_vptr_Allocator[3])(pvVar3->allocator,pvVar3->data);
          }
        }
      }
      pvVar3->data = (void *)0x0;
      pvVar3->elemsize = 0;
      pvVar3->elempack = 0;
      pvVar3->dims = 0;
      pvVar3->w = 0;
      pvVar3->h = 0;
      pvVar3->d = 0;
      pvVar3->c = 0;
      pvVar3->cstep = 0;
      pvVar3->refcount = (int *)0x0;
      pvVar3->data = local_b58->data;
      pvVar3->refcount = local_b58->refcount;
      pvVar3->elemsize = local_b58->elemsize;
      pvVar3->elempack = local_b58->elempack;
      pvVar3->allocator = local_b58->allocator;
      pvVar3->dims = local_b58->dims;
      pvVar3->w = local_b58->w;
      pvVar3->h = local_b58->h;
      pvVar3->d = local_b58->d;
      pvVar3->c = local_b58->c;
      pvVar3->cstep = local_b58->cstep;
    }
    local_b48 = pvVar3;
    local_c84 = Crop::forward(in_stack_fffffffffffff158,in_stack_fffffffffffff150,
                              (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                              CONCAT44(in_stack_fffffffffffff14c,in_stack_fffffffffffff148),
                              in_stack_fffffffffffff140);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_stack_ffffffffffffea20);
    pvVar6 = &local_11e0;
    local_b80 = pvVar6;
    local_568 = pvVar6;
    if (local_11e0.refcount != (int *)0x0) {
      local_56c = 0xffffffff;
      LOCK();
      local_570 = *local_11e0.refcount;
      *local_11e0.refcount = *local_11e0.refcount + -1;
      UNLOCK();
      if (local_570 == 1) {
        if (local_11e0.allocator == (Allocator *)0x0) {
          local_2f0 = local_11e0.data;
          if (local_11e0.data != (void *)0x0) {
            free(local_11e0.data);
          }
        }
        else {
          (*(local_11e0.allocator)->_vptr_Allocator[3])(local_11e0.allocator,local_11e0.data);
        }
      }
    }
    pvVar6->data = (void *)0x0;
    pvVar6->elemsize = 0;
    pvVar6->elempack = 0;
    pvVar6->dims = 0;
    pvVar6->w = 0;
    pvVar6->h = 0;
    pvVar6->d = 0;
    pvVar6->c = 0;
    pvVar6->cstep = 0;
    pvVar6->refcount = (int *)0x0;
    pvVar6 = &local_1158;
    if (local_1158.refcount != (int *)0x0) {
      local_58c = 0xffffffff;
      LOCK();
      local_590 = *local_1158.refcount;
      *local_1158.refcount = *local_1158.refcount + -1;
      UNLOCK();
      if (local_590 == 1) {
        local_b70 = pvVar6;
        local_588 = pvVar6;
        if (local_1158.allocator == (Allocator *)0x0) {
          local_2e0 = local_1158.data;
          if (local_1158.data != (void *)0x0) {
            free(local_1158.data);
          }
        }
        else {
          (*(local_1158.allocator)->_vptr_Allocator[3])(local_1158.allocator,local_1158.data);
        }
      }
    }
    pvVar6->data = (void *)0x0;
    pvVar6->elemsize = 0;
    pvVar6->elempack = 0;
    pvVar6->dims = 0;
    pvVar6->w = 0;
    pvVar6->h = 0;
    pvVar6->d = 0;
    pvVar6->c = 0;
    pvVar6->cstep = 0;
    pvVar6->refcount = (int *)0x0;
    return local_c84;
  }
  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == -0xe9) {
    local_c58 = &local_d50;
    local_c60 = local_cb0;
    if (local_cb0->dims == 1) {
      local_8ec = local_cb0->w * local_cb0->elempack;
      local_8e8 = &local_d50;
      local_8f8 = 0;
      local_900 = 4;
      local_908 = 0;
      local_d50.elemsize = 4;
      local_d50.elempack = 1;
      local_d50.dims = 1;
      local_d50.h = 1;
      local_d50.d = 1;
      local_d50.c = 1;
      local_d50.cstep = (size_t)local_8ec;
      local_d50.w = local_8ec;
    }
    else if (local_cb0->dims == 2) {
      local_874 = local_cb0->w;
      local_878 = local_cb0->h * local_cb0->elempack;
      local_870 = &local_d50;
      local_880 = 0;
      local_888 = 4;
      local_890 = 0;
      local_d50.elemsize = 4;
      local_d50.elempack = 1;
      local_d50.dims = 2;
      local_d50.d = 1;
      local_d50.c = 1;
      local_d50.cstep = (long)local_874 * (long)local_878;
      local_d50.w = local_874;
      local_d50.h = local_878;
    }
    else if (local_cb0->dims == 3) {
      local_7f4 = local_cb0->w;
      local_7f8 = local_cb0->h;
      local_7fc = local_cb0->c * local_cb0->elempack;
      local_7f0 = &local_d50;
      local_808 = 0;
      local_810 = 4;
      local_818 = 0;
      local_d50.elemsize = 4;
      local_d50.elempack = 1;
      local_d50.dims = 3;
      local_d50.d = 1;
      local_688 = (long)local_7f4 * (long)local_7f8 * 4;
      local_68c = 0x10;
      local_d50.cstep = (local_688 + 0xfU & 0xfffffffffffffff0) / 4;
      local_d50.w = local_7f4;
      local_d50.h = local_7f8;
      local_d50.c = local_7fc;
    }
    else if (local_cb0->dims == 4) {
      local_764 = local_cb0->w;
      local_768 = local_cb0->h;
      local_76c = local_cb0->d;
      local_770 = local_cb0->c * local_cb0->elempack;
      local_760 = &local_d50;
      local_778 = 0;
      local_780 = 4;
      local_788 = 0;
      local_d50.elemsize = 4;
      local_d50.elempack = 1;
      local_d50.dims = 4;
      local_6b8 = (long)local_764 * (long)local_768 * (long)local_76c * 4;
      local_6bc = 0x10;
      local_d50.cstep = (local_6b8 + 0xfU & 0xfffffffffffffff0) / 4;
      local_d50.w = local_764;
      local_d50.h = local_768;
      local_d50.d = local_76c;
      local_d50.c = local_770;
    }
    else {
      local_6f8 = &local_d50;
      local_d50.elemsize = 0;
      local_d50.elempack = 0;
      local_d50.dims = 0;
      local_d50.w = 0;
      local_d50.h = 0;
      local_d50.d = 0;
      local_d50.c = 0;
      local_d50.cstep = 0;
    }
    local_d50.allocator = (Allocator *)0x0;
    local_d50.refcount = (int *)0x0;
    local_d50.data = (void *)0x0;
    local_910 = local_cb8;
    in_stack_ffffffffffffea28 = &local_d08;
    in_stack_ffffffffffffea20 = (allocator_type *)&local_d04;
    piVar5 = &local_d00;
    Crop::resolve_crop_roi
              ((Crop *)((long)in_RDI + *(long *)(*in_RDI + -0x18)),&local_d50,(int *)local_cb8->data
               ,&local_cec,&local_cf0,&local_cf4,&local_cf8,&local_cfc,piVar5,
               (int *)in_stack_ffffffffffffea20,in_stack_ffffffffffffea28);
    local_c50 = &local_d50;
    local_3c8 = local_c50;
    if (local_d50.refcount != (int *)0x0) {
      local_3cc = 0xffffffff;
      LOCK();
      local_3d0 = *local_d50.refcount;
      *local_d50.refcount = *local_d50.refcount + -1;
      UNLOCK();
      if (local_3d0 == 1) {
        if (local_d50.allocator == (Allocator *)0x0) {
          local_3c0 = local_d50.data;
          if (local_d50.data != (void *)0x0) {
            free(local_d50.data);
          }
        }
        else {
          (*(local_d50.allocator)->_vptr_Allocator[3])(local_d50.allocator,local_d50.data);
        }
      }
    }
    local_d50.data = (void *)0x0;
    local_d50.elemsize = 0;
    local_d50.elempack = 0;
    local_d50.dims = 0;
    local_d50.w = 0;
    local_d50.h = 0;
    local_d50.d = 0;
    local_d50.c = 0;
    local_d50.cstep = 0;
    local_d50.refcount = (int *)0x0;
  }
  else {
    local_c68 = &local_da8;
    local_c70 = local_cb0;
    if (local_cb0->dims == 1) {
      local_8c4 = local_cb0->w * local_cb0->elempack;
      local_8c0 = &local_da8;
      local_8d0 = 0;
      local_8d8 = 4;
      local_8e0 = 0;
      local_da8.elemsize = 4;
      local_da8.elempack = 1;
      local_da8.dims = 1;
      local_da8.h = 1;
      local_da8.d = 1;
      local_da8.c = 1;
      local_da8.cstep = (size_t)local_8c4;
      local_da8.w = local_8c4;
    }
    else if (local_cb0->dims == 2) {
      local_84c = local_cb0->w;
      local_850 = local_cb0->h * local_cb0->elempack;
      local_848 = &local_da8;
      local_858 = 0;
      local_860 = 4;
      local_868 = 0;
      local_da8.elemsize = 4;
      local_da8.elempack = 1;
      local_da8.dims = 2;
      local_da8.d = 1;
      local_da8.c = 1;
      local_da8.cstep = (long)local_84c * (long)local_850;
      local_da8.w = local_84c;
      local_da8.h = local_850;
    }
    else if (local_cb0->dims == 3) {
      local_7c4 = local_cb0->w;
      local_7c8 = local_cb0->h;
      local_7cc = local_cb0->c * local_cb0->elempack;
      local_7c0 = &local_da8;
      local_7d8 = 0;
      local_7e0 = 4;
      local_7e8 = 0;
      local_da8.elemsize = 4;
      local_da8.elempack = 1;
      local_da8.dims = 3;
      local_da8.d = 1;
      local_698 = (long)local_7c4 * (long)local_7c8 * 4;
      local_69c = 0x10;
      local_da8.cstep = (local_698 + 0xfU & 0xfffffffffffffff0) / 4;
      local_da8.w = local_7c4;
      local_da8.h = local_7c8;
      local_da8.c = local_7cc;
    }
    else if (local_cb0->dims == 4) {
      local_734 = local_cb0->w;
      local_738 = local_cb0->h;
      local_73c = local_cb0->d;
      local_740 = local_cb0->c * local_cb0->elempack;
      local_730 = &local_da8;
      local_748 = 0;
      local_750 = 4;
      local_758 = 0;
      local_da8.elemsize = 4;
      local_da8.elempack = 1;
      local_da8.dims = 4;
      local_6c8 = (long)local_734 * (long)local_738 * (long)local_73c * 4;
      local_6cc = 0x10;
      local_da8.cstep = (local_6c8 + 0xfU & 0xfffffffffffffff0) / 4;
      local_da8.w = local_734;
      local_da8.h = local_738;
      local_da8.d = local_73c;
      local_da8.c = local_740;
    }
    else {
      local_6f0 = &local_da8;
      local_da8.elemsize = 0;
      local_da8.elempack = 0;
      local_da8.dims = 0;
      local_da8.w = 0;
      local_da8.h = 0;
      local_da8.d = 0;
      local_da8.c = 0;
      local_da8.cstep = 0;
    }
    local_da8.allocator = (Allocator *)0x0;
    local_da8.refcount = (int *)0x0;
    local_da8.data = (void *)0x0;
    local_c78 = &local_df0;
    local_c80 = local_cb8;
    if (local_cb8->dims == 1) {
      local_89c = local_cb8->w * local_cb8->elempack;
      local_898 = &local_df0;
      local_8a8 = 0;
      local_8b0 = 4;
      local_8b8 = 0;
      local_df0.elemsize = 4;
      local_df0.elempack = 1;
      local_df0.dims = 1;
      local_df0.h = 1;
      local_df0.d = 1;
      local_df0.c = 1;
      local_df0.cstep = (size_t)local_89c;
      local_df0.w = local_89c;
    }
    else if (local_cb8->dims == 2) {
      local_824 = local_cb8->w;
      local_828 = local_cb8->h * local_cb8->elempack;
      local_820 = &local_df0;
      local_830 = 0;
      local_838 = 4;
      local_840 = 0;
      local_df0.elemsize = 4;
      local_df0.elempack = 1;
      local_df0.dims = 2;
      local_df0.d = 1;
      local_df0.c = 1;
      local_df0.cstep = (long)local_824 * (long)local_828;
      local_df0.w = local_824;
      local_df0.h = local_828;
    }
    else if (local_cb8->dims == 3) {
      local_794 = local_cb8->w;
      local_798 = local_cb8->h;
      local_79c = local_cb8->c * local_cb8->elempack;
      local_790 = &local_df0;
      local_7a8 = 0;
      local_7b0 = 4;
      local_7b8 = 0;
      local_df0.elemsize = 4;
      local_df0.elempack = 1;
      local_df0.dims = 3;
      local_df0.d = 1;
      local_6a8 = (long)local_794 * (long)local_798 * 4;
      local_6ac = 0x10;
      local_df0.cstep = (local_6a8 + 0xfU & 0xfffffffffffffff0) / 4;
      local_df0.w = local_794;
      local_df0.h = local_798;
      local_df0.c = local_79c;
    }
    else if (local_cb8->dims == 4) {
      local_704 = local_cb8->w;
      local_708 = local_cb8->h;
      local_70c = local_cb8->d;
      local_710 = local_cb8->c * local_cb8->elempack;
      local_700 = &local_df0;
      local_718 = 0;
      local_720 = 4;
      local_728 = 0;
      local_df0.elemsize = 4;
      local_df0.elempack = 1;
      local_df0.dims = 4;
      local_6d8 = (long)local_704 * (long)local_708 * (long)local_70c * 4;
      local_6dc = 0x10;
      local_df0.cstep = (local_6d8 + 0xfU & 0xfffffffffffffff0) / 4;
      local_df0.w = local_704;
      local_df0.h = local_708;
      local_df0.d = local_70c;
      local_df0.c = local_710;
    }
    else {
      local_6e8 = &local_df0;
      local_df0.elemsize = 0;
      local_df0.elempack = 0;
      local_df0.dims = 0;
      local_df0.w = 0;
      local_df0.h = 0;
      local_df0.d = 0;
      local_df0.c = 0;
      local_df0.cstep = 0;
    }
    local_df0.allocator = (Allocator *)0x0;
    local_df0.refcount = (int *)0x0;
    local_df0.data = (void *)0x0;
    in_stack_ffffffffffffea28 = &local_d08;
    in_stack_ffffffffffffea20 = (allocator_type *)&local_d04;
    piVar5 = &local_d00;
    Crop::resolve_crop_roi
              ((Crop *)((long)in_RDI + *(long *)(*in_RDI + -0x18)),&local_da8,&local_df0,&local_cec,
               &local_cf0,&local_cf4,&local_cf8,&local_cfc,piVar5,(int *)in_stack_ffffffffffffea20,
               in_stack_ffffffffffffea28);
    local_c40 = &local_df0;
    local_3e8 = local_c40;
    if (local_df0.refcount != (int *)0x0) {
      local_3ec = 0xffffffff;
      LOCK();
      local_3f0 = *local_df0.refcount;
      *local_df0.refcount = *local_df0.refcount + -1;
      UNLOCK();
      if (local_3f0 == 1) {
        if (local_df0.allocator == (Allocator *)0x0) {
          local_3b0 = local_df0.data;
          if (local_df0.data != (void *)0x0) {
            free(local_df0.data);
          }
        }
        else {
          (*(local_df0.allocator)->_vptr_Allocator[3])(local_df0.allocator,local_df0.data);
        }
      }
    }
    local_df0.data = (void *)0x0;
    local_df0.elemsize = 0;
    local_df0.elempack = 0;
    local_df0.dims = 0;
    local_df0.w = 0;
    local_df0.h = 0;
    local_df0.d = 0;
    local_df0.c = 0;
    local_df0.cstep = 0;
    local_df0.refcount = (int *)0x0;
    local_c30 = &local_da8;
    local_408 = local_c30;
    if (local_da8.refcount != (int *)0x0) {
      local_40c = 0xffffffff;
      LOCK();
      local_410 = *local_da8.refcount;
      *local_da8.refcount = *local_da8.refcount + -1;
      UNLOCK();
      if (local_410 == 1) {
        if (local_da8.allocator == (Allocator *)0x0) {
          local_3a0 = local_da8.data;
          if (local_da8.data != (void *)0x0) {
            free(local_da8.data);
          }
        }
        else {
          (*(local_da8.allocator)->_vptr_Allocator[3])(local_da8.allocator,local_da8.data);
        }
      }
    }
    local_da8.data = (void *)0x0;
    local_da8.elemsize = 0;
    local_da8.elempack = 0;
    local_da8.dims = 0;
    local_da8.w = 0;
    local_da8.h = 0;
    local_da8.d = 0;
    local_da8.c = 0;
    local_da8.cstep = 0;
    local_da8.refcount = (int *)0x0;
  }
  pvVar2 = local_ce8;
  iVar7 = (int)((ulong)in_stack_ffffffffffffea28 >> 0x20);
  if (local_ccc == 1) {
    local_df4 = 1;
    if (local_cfc % 4 == 0) {
      local_df4 = 4;
    }
    local_e00 = (local_cd8 / (ulong)(long)local_cdc) * (long)local_df4;
    if ((local_cfc / local_df4 == local_cbc) && (local_df4 == 4)) {
      local_a70 = local_ce8;
      local_a78 = local_cb0;
      if (local_ce8 != local_cb0) {
        if (local_cb0->refcount != (int *)0x0) {
          piVar5 = local_cb0->refcount;
          local_a7c = 1;
          LOCK();
          local_a80 = *piVar5;
          *piVar5 = *piVar5 + 1;
          UNLOCK();
        }
        local_618 = local_ce8;
        if (local_ce8->refcount != (int *)0x0) {
          piVar5 = local_ce8->refcount;
          local_61c = 0xffffffff;
          LOCK();
          local_620 = *piVar5;
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (local_620 == 1) {
            if (local_ce8->allocator == (Allocator *)0x0) {
              local_298 = local_ce8->data;
              if (local_298 != (void *)0x0) {
                free(local_298);
              }
            }
            else {
              (*local_ce8->allocator->_vptr_Allocator[3])
                        (local_ce8->allocator,local_ce8->data,
                         (long)local_cfc % (long)local_df4 & 0xffffffff);
            }
          }
        }
        pvVar2->data = (void *)0x0;
        pvVar2->elemsize = 0;
        pvVar2->elempack = 0;
        pvVar2->dims = 0;
        pvVar2->w = 0;
        pvVar2->h = 0;
        pvVar2->d = 0;
        pvVar2->c = 0;
        pvVar2->cstep = 0;
        pvVar2->refcount = (int *)0x0;
        pvVar2->data = local_a78->data;
        pvVar2->refcount = local_a78->refcount;
        pvVar2->elemsize = local_a78->elemsize;
        pvVar2->elempack = local_a78->elempack;
        pvVar2->allocator = local_a78->allocator;
        pvVar2->dims = local_a78->dims;
        pvVar2->w = local_a78->w;
        pvVar2->h = local_a78->h;
        pvVar2->d = local_a78->d;
        pvVar2->c = local_a78->c;
        pvVar2->cstep = local_a78->cstep;
      }
      return 0;
    }
    if ((local_cec % 4 == 0) && (local_df4 == 4)) {
      Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffea44,in_stack_ffffffffffffea40),
                  in_stack_ffffffffffffea3c,
                  CONCAT44(in_stack_ffffffffffffea34,in_stack_ffffffffffffea30),iVar7,
                  (Allocator *)in_stack_ffffffffffffea20);
      local_a38 = local_ce8;
      bVar4 = true;
      if (local_ce8->data != (void *)0x0) {
        local_260 = local_ce8;
        bVar4 = local_ce8->cstep * (long)local_ce8->c == 0;
      }
      if (!bVar4) {
        crop_pack4_sse(local_cb0,local_ce8,0,local_cec / local_cdc);
        return 0;
      }
      return -100;
    }
  }
  if (local_ccc == 2) {
    local_e04 = 1;
    if (local_d00 % 4 == 0) {
      local_e04 = 4;
    }
    local_e10 = (local_cd8 / (ulong)(long)local_cdc) * (long)local_e04;
    if (((local_cfc == local_cbc) && (local_d00 / local_e04 == local_cc0)) && (local_e04 == 4)) {
      local_a90 = local_ce8;
      local_a98 = local_cb0;
      if (local_ce8 != local_cb0) {
        if (local_cb0->refcount != (int *)0x0) {
          piVar5 = local_cb0->refcount;
          local_a9c = 1;
          LOCK();
          local_aa0 = *piVar5;
          *piVar5 = *piVar5 + 1;
          UNLOCK();
        }
        local_608 = local_ce8;
        if (local_ce8->refcount != (int *)0x0) {
          piVar5 = local_ce8->refcount;
          local_60c = 0xffffffff;
          LOCK();
          local_610 = *piVar5;
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (local_610 == 1) {
            if (local_ce8->allocator == (Allocator *)0x0) {
              local_2a0 = local_ce8->data;
              if (local_2a0 != (void *)0x0) {
                free(local_2a0);
              }
            }
            else {
              (*local_ce8->allocator->_vptr_Allocator[3])
                        (local_ce8->allocator,local_ce8->data,
                         (long)local_d00 % (long)local_e04 & 0xffffffff);
            }
          }
        }
        pvVar2->data = (void *)0x0;
        pvVar2->elemsize = 0;
        pvVar2->elempack = 0;
        pvVar2->dims = 0;
        pvVar2->w = 0;
        pvVar2->h = 0;
        pvVar2->d = 0;
        pvVar2->c = 0;
        pvVar2->cstep = 0;
        pvVar2->refcount = (int *)0x0;
        pvVar2->data = local_a98->data;
        pvVar2->refcount = local_a98->refcount;
        pvVar2->elemsize = local_a98->elemsize;
        pvVar2->elempack = local_a98->elempack;
        pvVar2->allocator = local_a98->allocator;
        pvVar2->dims = local_a98->dims;
        pvVar2->w = local_a98->w;
        pvVar2->h = local_a98->h;
        pvVar2->d = local_a98->d;
        pvVar2->c = local_a98->c;
        pvVar2->cstep = local_a98->cstep;
      }
      return 0;
    }
    if ((local_cf0 % 4 == 0) && (local_e04 == 4)) {
      Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffea44,in_stack_ffffffffffffea40),
                  in_stack_ffffffffffffea3c,in_stack_ffffffffffffea38,
                  CONCAT44(in_stack_ffffffffffffea34,in_stack_ffffffffffffea30),iVar7,
                  (Allocator *)in_stack_ffffffffffffea20);
      local_a40 = local_ce8;
      bVar4 = true;
      if (local_ce8->data != (void *)0x0) {
        local_258 = local_ce8;
        bVar4 = local_ce8->cstep * (long)local_ce8->c == 0;
      }
      if (!bVar4) {
        crop_pack4_sse(local_cb0,local_ce8,local_cf0 / local_cdc,local_cec);
        return 0;
      }
      return -100;
    }
  }
  if (local_ccc == 3) {
    local_e14 = 1;
    if (local_d08 % 4 == 0) {
      local_e14 = 4;
    }
    local_e20 = (local_cd8 / (ulong)(long)local_cdc) * (long)local_e14;
    if (((local_cfc == local_cbc) && (local_d00 == local_cc0)) &&
       ((local_d08 / local_e14 == local_cc8 && (local_e14 == 4)))) {
      local_ab0 = local_ce8;
      local_ab8 = local_cb0;
      if (local_ce8 != local_cb0) {
        if (local_cb0->refcount != (int *)0x0) {
          piVar5 = local_cb0->refcount;
          local_abc = 1;
          LOCK();
          local_ac0 = *piVar5;
          *piVar5 = *piVar5 + 1;
          UNLOCK();
        }
        local_5f8 = local_ce8;
        if (local_ce8->refcount != (int *)0x0) {
          piVar5 = local_ce8->refcount;
          local_5fc = 0xffffffff;
          LOCK();
          local_600 = *piVar5;
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (local_600 == 1) {
            if (local_ce8->allocator == (Allocator *)0x0) {
              local_2a8 = local_ce8->data;
              if (local_2a8 != (void *)0x0) {
                free(local_2a8);
              }
            }
            else {
              (*local_ce8->allocator->_vptr_Allocator[3])
                        (local_ce8->allocator,local_ce8->data,
                         (long)local_d08 % (long)local_e14 & 0xffffffff);
            }
          }
        }
        pvVar2->data = (void *)0x0;
        pvVar2->elemsize = 0;
        pvVar2->elempack = 0;
        pvVar2->dims = 0;
        pvVar2->w = 0;
        pvVar2->h = 0;
        pvVar2->d = 0;
        pvVar2->c = 0;
        pvVar2->cstep = 0;
        pvVar2->refcount = (int *)0x0;
        pvVar2->data = local_ab8->data;
        pvVar2->refcount = local_ab8->refcount;
        pvVar2->elemsize = local_ab8->elemsize;
        pvVar2->elempack = local_ab8->elempack;
        pvVar2->allocator = local_ab8->allocator;
        pvVar2->dims = local_ab8->dims;
        pvVar2->w = local_ab8->w;
        pvVar2->h = local_ab8->h;
        pvVar2->d = local_ab8->d;
        pvVar2->c = local_ab8->c;
        pvVar2->cstep = local_ab8->cstep;
      }
      return 0;
    }
    if ((local_cf8 % 4 == 0) && (local_e14 == 4)) {
      local_9fc = local_cf8 / 4;
      local_a00 = local_d08 / 4;
      local_9f0 = &local_e68;
      local_204 = local_cb0->w;
      local_208 = local_cb0->h;
      local_20c = local_cb0->d;
      local_218 = (void *)((long)local_cb0->data +
                          local_cb0->cstep * (long)local_9fc * local_cb0->elemsize);
      local_220 = local_cb0->elemsize;
      local_224 = local_cb0->elempack;
      local_230 = local_cb0->allocator;
      local_200 = &local_e68;
      local_e60 = (int *)0x0;
      local_1f0 = (long)local_204 * (long)local_208 * (long)(int)local_20c * local_220;
      local_e28 = (local_1f0 + 0xfU & 0xfffffffffffffff0) / local_220;
      local_e40 = local_cb0->dims;
      local_1f4 = 0x10;
      local_9f8 = local_cb0;
      local_a01 = 1;
      local_210 = local_a00;
      local_e68 = local_218;
      local_e58 = local_220;
      local_e50 = local_224;
      local_e48 = local_230;
      local_e3c = local_204;
      local_e38 = local_208;
      local_e34 = local_20c;
      local_e30 = local_a00;
      if ((local_cfc == local_cbc) && (local_d00 == local_cc0)) {
        Mat::clone((Mat *)&stack0xfffffffffffff150,(__fn *)&local_e68,(void *)0x0,(int)local_200,
                   (void *)(ulong)local_20c);
        pvVar2 = local_ce8;
        local_ad0 = local_ce8;
        local_ad8 = (const_reference)&stack0xfffffffffffff150;
        if (local_ce8 != local_ad8) {
          if (in_stack_fffffffffffff158 != (Crop *)0x0) {
            local_adc = 1;
            LOCK();
            local_ae0 = *(undefined4 *)&(in_stack_fffffffffffff158->super_Layer)._vptr_Layer;
            *(int *)&(in_stack_fffffffffffff158->super_Layer)._vptr_Layer =
                 *(int *)&(in_stack_fffffffffffff158->super_Layer)._vptr_Layer + 1;
            UNLOCK();
          }
          local_5e8 = local_ce8;
          if (local_ce8->refcount != (int *)0x0) {
            piVar5 = local_ce8->refcount;
            local_5ec = 0xffffffff;
            LOCK();
            local_5f0 = *piVar5;
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (local_5f0 == 1) {
              if (local_ce8->allocator == (Allocator *)0x0) {
                local_2b0 = local_ce8->data;
                if (local_2b0 != (void *)0x0) {
                  free(local_2b0);
                }
              }
              else {
                (*local_ce8->allocator->_vptr_Allocator[3])(local_ce8->allocator,local_ce8->data);
              }
            }
          }
          pvVar2->data = (void *)0x0;
          pvVar2->elemsize = 0;
          pvVar2->elempack = 0;
          pvVar2->dims = 0;
          pvVar2->w = 0;
          pvVar2->h = 0;
          pvVar2->d = 0;
          pvVar2->c = 0;
          pvVar2->cstep = 0;
          pvVar2->refcount = (int *)0x0;
          pvVar2->data = local_ad8->data;
          pvVar2->refcount = local_ad8->refcount;
          pvVar2->elemsize = local_ad8->elemsize;
          pvVar2->elempack = local_ad8->elempack;
          pvVar2->allocator = local_ad8->allocator;
          pvVar2->dims = local_ad8->dims;
          pvVar2->w = local_ad8->w;
          pvVar2->h = local_ad8->h;
          pvVar2->d = local_ad8->d;
          pvVar2->c = local_ad8->c;
          pvVar2->cstep = local_ad8->cstep;
        }
        local_ac8 = pvVar2;
        local_c20 = &stack0xfffffffffffff150;
        local_428 = local_c20;
        if (in_stack_fffffffffffff158 != (Crop *)0x0) {
          local_42c = 0xffffffff;
          LOCK();
          local_430 = *(int *)&(in_stack_fffffffffffff158->super_Layer)._vptr_Layer;
          *(int *)&(in_stack_fffffffffffff158->super_Layer)._vptr_Layer =
               *(int *)&(in_stack_fffffffffffff158->super_Layer)._vptr_Layer + -1;
          UNLOCK();
          if (local_430 == 1) {
            if (local_e90 == (Allocator *)0x0) {
              if (in_stack_fffffffffffff150 != (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)0x0)
              {
                free(in_stack_fffffffffffff150);
              }
            }
            else {
              (*local_e90->_vptr_Allocator[3])(local_e90,in_stack_fffffffffffff150);
            }
          }
        }
        local_a48 = local_ce8;
        bVar4 = true;
        if (local_ce8->data != (void *)0x0) {
          local_250 = local_ce8;
          bVar4 = local_ce8->cstep * (long)local_ce8->c == 0;
        }
        if (bVar4) {
          local_c84 = -100;
          goto LAB_009f4e81;
        }
      }
      Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffea44,in_stack_ffffffffffffea40),
                  in_stack_ffffffffffffea3c,in_stack_ffffffffffffea38,in_stack_ffffffffffffea34,
                  (size_t)in_stack_ffffffffffffea28,(int)((ulong)in_stack_ffffffffffffea20 >> 0x20),
                  in_stack_ffffffffffffeaa0);
      local_a50 = local_ce8;
      bVar4 = true;
      if (local_ce8->data != (void *)0x0) {
        local_248 = local_ce8;
        bVar4 = local_ce8->cstep * (long)local_ce8->c == 0;
      }
      if (bVar4) {
        local_c84 = -100;
      }
      else {
        for (iVar7 = 0; iVar7 < local_ce8->c; iVar7 = iVar7 + 1) {
          local_9b0 = &local_f00;
          local_9b8 = &local_e68;
          local_f8 = (void *)((long)local_e68 + local_e28 * (long)iVar7 * local_e58);
          local_e0 = &local_f00;
          local_ef8 = (int *)0x0;
          local_ef0 = local_e58;
          local_ee8 = local_e50;
          local_ee0 = local_e48;
          local_ed4 = local_e3c;
          local_ed0 = local_e38;
          local_ecc = 1;
          local_ec8 = local_e34;
          local_d0 = (long)local_e3c * (long)local_e38 * local_e58;
          local_ed8 = local_e40 + -1;
          local_970 = &local_f48;
          local_174 = local_ce8->w;
          local_178 = local_ce8->h;
          local_17c = local_ce8->d;
          local_188 = (void *)((long)local_ce8->data +
                              local_ce8->cstep * (long)iVar7 * local_ce8->elemsize);
          local_190 = local_ce8->elemsize;
          local_194 = local_ce8->elempack;
          local_1a0 = local_ce8->allocator;
          local_170 = &local_f48;
          local_f48.refcount = (int *)0x0;
          local_f48.d = 1;
          local_160 = (long)local_174 * (long)local_178 * local_190;
          local_f48.cstep = (local_160 + 0xfU & 0xfffffffffffffff0) / local_190;
          local_f48.dims = local_ce8->dims + -1;
          if (local_ce8->dims == 4) {
            local_f48.cstep = (long)local_ce8->w * (long)local_ce8->h;
          }
          local_d4 = 0x10;
          local_e4 = local_e3c;
          local_e8 = local_e38;
          local_ec = local_e34;
          local_100 = local_e58;
          local_104 = local_e50;
          local_110 = local_e48;
          local_164 = 0x10;
          local_978 = local_ce8;
          local_97d = 1;
          local_9bd = 1;
          local_9bc = iVar7;
          local_97c = iVar7;
          local_f48.data = local_188;
          local_f48.elemsize = local_190;
          local_f48.elempack = local_194;
          local_f48.allocator = local_1a0;
          local_f48.w = local_174;
          local_f48.h = local_178;
          local_f48.c = local_17c;
          local_f00 = local_f8;
          crop_pack4_sse((Mat *)&local_f00,&local_f48,local_cf0,local_cec);
          local_c10 = &local_f48;
          local_448 = local_c10;
          if (local_f48.refcount != (int *)0x0) {
            local_44c = 0xffffffff;
            LOCK();
            local_450 = *local_f48.refcount;
            *local_f48.refcount = *local_f48.refcount + -1;
            UNLOCK();
            if (local_450 == 1) {
              if (local_f48.allocator == (Allocator *)0x0) {
                local_380 = local_f48.data;
                if (local_f48.data != (void *)0x0) {
                  free(local_f48.data);
                }
              }
              else {
                (*(local_f48.allocator)->_vptr_Allocator[3])(local_f48.allocator,local_f48.data);
              }
            }
          }
          local_f48.data = (void *)0x0;
          local_f48.elemsize = 0;
          local_f48.elempack = 0;
          local_f48.dims = 0;
          local_f48.w = 0;
          local_f48.h = 0;
          local_f48.d = 0;
          local_f48.c = 0;
          local_f48.cstep = 0;
          local_f48.refcount = (int *)0x0;
          local_c00 = &local_f00;
          local_468 = local_c00;
          if (local_ef8 != (int *)0x0) {
            local_46c = 0xffffffff;
            LOCK();
            local_470 = *local_ef8;
            *local_ef8 = *local_ef8 + -1;
            UNLOCK();
            if (local_470 == 1) {
              if (local_ee0 == (Allocator *)0x0) {
                local_370 = local_f00;
                if (local_f00 != (void *)0x0) {
                  free(local_f00);
                }
              }
              else {
                (*local_ee0->_vptr_Allocator[3])(local_ee0,local_f00);
              }
            }
          }
          local_f00 = (void *)0x0;
          local_ef0 = 0;
          local_ee8 = 0;
          local_ed8 = 0;
          local_ed4 = 0;
          local_ed0 = 0;
          local_ecc = 0;
          local_ec8 = 0;
          local_ef8 = (int *)0x0;
        }
        local_c84 = 0;
      }
LAB_009f4e81:
      local_bf0 = &local_e68;
      if (local_e60 != (int *)0x0) {
        local_48c = 0xffffffff;
        LOCK();
        local_490 = *local_e60;
        *local_e60 = *local_e60 + -1;
        UNLOCK();
        if (local_490 == 1) {
          local_488 = local_bf0;
          if (local_e48 == (Allocator *)0x0) {
            local_360 = local_e68;
            if (local_e68 != (void *)0x0) {
              free(local_e68);
            }
          }
          else {
            (*local_e48->_vptr_Allocator[3])(local_e48,local_e68);
          }
        }
      }
      return local_c84;
    }
  }
  if (local_ccc != 4) goto LAB_009f7015;
  local_f4c = 1;
  if (local_d08 % 4 == 0) {
    local_f4c = 4;
  }
  local_f58 = (local_cd8 / (ulong)(long)local_cdc) * (long)local_f4c;
  if ((((local_cfc == local_cbc) && (local_d00 == local_cc0)) && (local_d04 == local_cc4)) &&
     ((local_d08 / local_f4c == local_cc8 && (local_f4c == 4)))) {
    local_af0 = local_ce8;
    local_af8 = local_cb0;
    if (local_ce8 != local_cb0) {
      if (local_cb0->refcount != (int *)0x0) {
        piVar5 = local_cb0->refcount;
        local_afc = 1;
        LOCK();
        local_b00 = *piVar5;
        *piVar5 = *piVar5 + 1;
        UNLOCK();
      }
      local_5d8 = local_ce8;
      if (local_ce8->refcount != (int *)0x0) {
        piVar5 = local_ce8->refcount;
        local_5dc = 0xffffffff;
        LOCK();
        local_5e0 = *piVar5;
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (local_5e0 == 1) {
          if (local_ce8->allocator == (Allocator *)0x0) {
            local_2b8 = local_ce8->data;
            if (local_2b8 != (void *)0x0) {
              free(local_2b8);
            }
          }
          else {
            (*local_ce8->allocator->_vptr_Allocator[3])
                      (local_ce8->allocator,local_ce8->data,
                       (long)local_d08 % (long)local_f4c & 0xffffffff);
          }
        }
      }
      pvVar2->data = (void *)0x0;
      pvVar2->elemsize = 0;
      pvVar2->elempack = 0;
      pvVar2->dims = 0;
      pvVar2->w = 0;
      pvVar2->h = 0;
      pvVar2->d = 0;
      pvVar2->c = 0;
      pvVar2->cstep = 0;
      pvVar2->refcount = (int *)0x0;
      pvVar2->data = local_af8->data;
      pvVar2->refcount = local_af8->refcount;
      pvVar2->elemsize = local_af8->elemsize;
      pvVar2->elempack = local_af8->elempack;
      pvVar2->allocator = local_af8->allocator;
      pvVar2->dims = local_af8->dims;
      pvVar2->w = local_af8->w;
      pvVar2->h = local_af8->h;
      pvVar2->d = local_af8->d;
      pvVar2->c = local_af8->c;
      pvVar2->cstep = local_af8->cstep;
    }
    return 0;
  }
  if ((local_cf8 % 4 != 0) || (local_f4c != 4)) goto LAB_009f7015;
  local_a24 = local_cf8 / 4;
  local_a28 = local_d08 / 4;
  local_a18 = &local_fa0;
  local_1bc = local_cb0->w;
  local_1c0 = local_cb0->h;
  local_1c4 = local_cb0->d;
  local_1d0 = (void *)((long)local_cb0->data +
                      local_cb0->cstep * (long)local_a24 * local_cb0->elemsize);
  local_1d8 = local_cb0->elemsize;
  local_1dc = local_cb0->elempack;
  local_1e8 = local_cb0->allocator;
  local_1b8 = &local_fa0;
  local_f98 = (int *)0x0;
  local_1a8 = (long)local_1bc * (long)local_1c0 * (long)(int)local_1c4 * local_1d8;
  local_f60 = (local_1a8 + 0xfU & 0xfffffffffffffff0) / local_1d8;
  local_f78 = local_cb0->dims;
  local_1ac = 0x10;
  local_a20 = local_cb0;
  local_a29 = 1;
  local_1c8 = local_a28;
  local_fa0 = local_1d0;
  local_f90 = local_1d8;
  local_f88 = local_1dc;
  local_f80 = local_1e8;
  local_f74 = local_1bc;
  local_f70 = local_1c0;
  local_f6c = local_1c4;
  local_f68 = local_a28;
  if (((local_cfc == local_cbc) && (local_d00 == local_cc0)) && (local_d04 == local_cc4)) {
    Mat::clone(&local_fe8,(__fn *)&local_fa0,(void *)0x0,(int)local_1b8,(void *)(ulong)local_1c4);
    pvVar2 = local_ce8;
    local_b10 = local_ce8;
    local_b18 = &local_fe8;
    if (local_ce8 != local_b18) {
      if (local_fe8.refcount != (int *)0x0) {
        local_b1c = 1;
        LOCK();
        local_b20 = *local_fe8.refcount;
        *local_fe8.refcount = *local_fe8.refcount + 1;
        UNLOCK();
      }
      local_5c8 = local_ce8;
      if (local_ce8->refcount != (int *)0x0) {
        piVar1 = local_ce8->refcount;
        local_5cc = 0xffffffff;
        LOCK();
        local_5d0 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (local_5d0 == 1) {
          if (local_ce8->allocator == (Allocator *)0x0) {
            local_2c0 = local_ce8->data;
            if (local_2c0 != (void *)0x0) {
              free(local_2c0);
            }
          }
          else {
            (*local_ce8->allocator->_vptr_Allocator[3])(local_ce8->allocator,local_ce8->data);
          }
        }
      }
      pvVar2->data = (void *)0x0;
      pvVar2->elemsize = 0;
      pvVar2->elempack = 0;
      pvVar2->dims = 0;
      pvVar2->w = 0;
      pvVar2->h = 0;
      pvVar2->d = 0;
      pvVar2->c = 0;
      pvVar2->cstep = 0;
      pvVar2->refcount = (int *)0x0;
      pvVar2->data = local_b18->data;
      pvVar2->refcount = local_b18->refcount;
      pvVar2->elemsize = local_b18->elemsize;
      pvVar2->elempack = local_b18->elempack;
      pvVar2->allocator = local_b18->allocator;
      pvVar2->dims = local_b18->dims;
      pvVar2->w = local_b18->w;
      pvVar2->h = local_b18->h;
      pvVar2->d = local_b18->d;
      pvVar2->c = local_b18->c;
      pvVar2->cstep = local_b18->cstep;
    }
    local_b08 = pvVar2;
    local_be0 = &local_fe8;
    local_4a8 = local_be0;
    if (local_fe8.refcount != (int *)0x0) {
      local_4ac = 0xffffffff;
      LOCK();
      local_4b0 = *local_fe8.refcount;
      *local_fe8.refcount = *local_fe8.refcount + -1;
      UNLOCK();
      if (local_4b0 == 1) {
        if (local_fe8.allocator == (Allocator *)0x0) {
          if (local_fe8.data != (void *)0x0) {
            free(local_fe8.data);
          }
        }
        else {
          (*(local_fe8.allocator)->_vptr_Allocator[3])(local_fe8.allocator,local_fe8.data);
        }
      }
    }
    local_fe8.data = (void *)0x0;
    local_fe8.elemsize = 0;
    local_fe8.elempack = 0;
    local_fe8.dims = 0;
    local_fe8.w = 0;
    local_fe8.h = 0;
    local_fe8.d = 0;
    local_fe8.c = 0;
    local_fe8.cstep = 0;
    local_fe8.refcount = (int *)0x0;
    local_a58 = local_ce8;
    bVar4 = true;
    if (local_ce8->data != (void *)0x0) {
      local_240 = local_ce8;
      bVar4 = local_ce8->cstep * (long)local_ce8->c == 0;
    }
    if (bVar4) {
      local_c84 = -100;
      goto LAB_009f6dc1;
    }
  }
  Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffea34,in_stack_ffffffffffffea30),
              (int)((ulong)in_stack_ffffffffffffea28 >> 0x20),(int)in_stack_ffffffffffffea28,
              (int)((ulong)in_stack_ffffffffffffea20 >> 0x20),(int)in_stack_ffffffffffffea20,
              (size_t)piVar5,in_stack_ffffffffffffea90,in_stack_ffffffffffffea98);
  local_a60 = local_ce8;
  bVar4 = true;
  if (local_ce8->data != (void *)0x0) {
    local_238 = local_ce8;
    bVar4 = local_ce8->cstep * (long)local_ce8->c == 0;
  }
  if (bVar4) {
    local_c84 = -100;
  }
  else {
    for (local_fec = 0; local_fec < local_ce8->c; local_fec = local_fec + 1) {
      for (local_ff0 = 0; local_ff0 < local_d04; local_ff0 = local_ff0 + 1) {
        local_9d0 = &local_1080;
        local_9d8 = &local_fa0;
        local_b0 = (void *)((long)local_fa0 + local_f60 * (long)local_fec * local_f90);
        local_98 = &local_1080;
        local_88 = (long)local_f74 * (long)local_f70 * local_f90;
        local_95c = local_ff0 + local_cf4;
        local_950 = &local_1038;
        local_958 = &local_1080;
        local_38 = (void *)((long)local_b0 +
                           (long)local_f74 * (long)local_f70 * (long)local_95c * local_f90);
        local_28 = &local_1038;
        local_1038.cstep = (long)local_f74 * (long)local_f70;
        local_bd0 = &local_1080;
        local_990 = &local_1110;
        local_12c = local_ce8->w;
        local_130 = local_ce8->h;
        local_134 = local_ce8->d;
        local_140 = (void *)((long)local_ce8->data +
                            local_ce8->cstep * (long)local_fec * local_ce8->elemsize);
        local_148 = local_ce8->elemsize;
        local_14c = local_ce8->elempack;
        local_158 = local_ce8->allocator;
        local_128 = &local_1110;
        local_118 = (long)local_12c * (long)local_130 * local_148;
        local_938 = &local_10c8;
        local_940 = &local_1110;
        local_68 = (void *)((long)local_140 +
                           (long)local_12c * (long)local_130 * (long)local_ff0 * local_148);
        local_58 = &local_10c8;
        local_10c8.cstep = (long)local_12c * (long)local_130;
        local_bc0 = &local_1110;
        local_1038.c = 1;
        local_1038.d = 1;
        local_1038.h = local_f70;
        local_1038.w = local_f74;
        local_1038.dims = 2;
        local_1038.allocator = local_f80;
        local_1038.elempack = local_f88;
        local_1038.elemsize = local_f90;
        local_1038.refcount = (int *)0x0;
        local_1048 = 0;
        local_104c = 0;
        local_1050 = 0;
        local_1054 = 0;
        local_1060 = local_f80;
        local_1068 = 0;
        local_1070 = 0;
        local_1078 = 0;
        local_1080 = 0;
        local_10c8.c = 1;
        local_10c8.d = 1;
        local_10c8.dims = 2;
        local_10c8.refcount = (int *)0x0;
        local_2c = local_f74;
        local_30 = local_f70;
        local_40 = local_f90;
        local_44 = local_f88;
        local_50 = local_f80;
        local_8c = 0x10;
        local_9c = local_f74;
        local_a0 = local_f70;
        local_a4 = local_f6c;
        local_b8 = local_f90;
        local_bc = local_f88;
        local_c8 = local_f80;
        local_11c = 0x10;
        local_944 = local_ff0;
        local_998 = local_ce8;
        local_99c = local_fec;
        local_99d = 1;
        local_9dc = local_fec;
        local_9dd = 1;
        local_1040 = 0;
        local_1058 = 0;
        local_1110 = 0;
        local_1100 = 0;
        local_10f8 = 0;
        local_10e8 = 0;
        local_10e4 = 0;
        local_10e0 = 0;
        local_10dc = 0;
        local_10d8 = 0;
        local_10d0 = 0;
        local_1108 = 0;
        local_4e8 = local_bc0;
        local_4c8 = local_bd0;
        local_80 = local_158;
        local_74 = local_14c;
        local_70 = local_148;
        local_60 = local_130;
        local_5c = local_12c;
        local_10f0 = local_158;
        local_10c8.data = local_68;
        local_10c8.elemsize = local_148;
        local_10c8.elempack = local_14c;
        local_10c8.allocator = local_158;
        local_10c8.w = local_12c;
        local_10c8.h = local_130;
        local_1038.data = local_38;
        crop_pack4_sse(&local_1038,&local_10c8,local_cf0,local_cec);
        local_bb0 = &local_10c8;
        local_508 = local_bb0;
        if (local_10c8.refcount != (int *)0x0) {
          local_50c = 0xffffffff;
          LOCK();
          local_510 = *local_10c8.refcount;
          *local_10c8.refcount = *local_10c8.refcount + -1;
          UNLOCK();
          if (local_510 == 1) {
            if (local_10c8.allocator == (Allocator *)0x0) {
              local_320 = local_10c8.data;
              if (local_10c8.data != (void *)0x0) {
                free(local_10c8.data);
              }
            }
            else {
              (*(local_10c8.allocator)->_vptr_Allocator[3])(local_10c8.allocator,local_10c8.data);
            }
          }
        }
        local_10c8.data = (void *)0x0;
        local_10c8.elemsize = 0;
        local_10c8.elempack = 0;
        local_10c8.dims = 0;
        local_10c8.w = 0;
        local_10c8.h = 0;
        local_10c8.d = 0;
        local_10c8.c = 0;
        local_10c8.cstep = 0;
        local_10c8.refcount = (int *)0x0;
        local_ba0 = &local_1038;
        local_528 = local_ba0;
        if (local_1038.refcount != (int *)0x0) {
          local_52c = 0xffffffff;
          LOCK();
          local_530 = *local_1038.refcount;
          *local_1038.refcount = *local_1038.refcount + -1;
          UNLOCK();
          if (local_530 == 1) {
            if (local_1038.allocator == (Allocator *)0x0) {
              local_310 = local_1038.data;
              if (local_1038.data != (void *)0x0) {
                free(local_1038.data);
              }
            }
            else {
              (*(local_1038.allocator)->_vptr_Allocator[3])(local_1038.allocator,local_1038.data);
            }
          }
        }
        local_1038.data = (void *)0x0;
        local_1038.elemsize = 0;
        local_1038.elempack = 0;
        local_1038.dims = 0;
        local_1038.w = 0;
        local_1038.h = 0;
        local_1038.d = 0;
        local_1038.c = 0;
        local_1038.cstep = 0;
        local_1038.refcount = (int *)0x0;
      }
    }
    local_c84 = 0;
  }
LAB_009f6dc1:
  local_b90 = &local_fa0;
  if (local_f98 == (int *)0x0) {
    return local_c84;
  }
  local_54c = 0xffffffff;
  LOCK();
  local_550 = *local_f98;
  *local_f98 = *local_f98 + -1;
  UNLOCK();
  if (local_550 != 1) {
    return local_c84;
  }
  local_548 = local_b90;
  if (local_f80 != (Allocator *)0x0) {
    (*local_f80->_vptr_Allocator[3])(local_f80,local_fa0);
    return local_c84;
  }
  local_300 = local_fa0;
  if (local_fa0 == (void *)0x0) {
    return local_c84;
  }
  free(local_fa0);
  return local_c84;
}

Assistant:

int Crop_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& reference_blob = bottom_blobs[1];

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    int ref_elempack = reference_blob.elempack;

    Mat& top_blob = top_blobs[0];

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        if (woffset == -233)
        {
            resolve_crop_roi(bottom_blob.shape(), (const int*)reference_blob, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
        }
        else
        {
            resolve_crop_roi(bottom_blob.shape(), reference_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
        }

        if (dims == 1)
        {
            int out_elempack = _outw % 16 == 0 ? 16 : _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 16 == 0 && out_elempack == 16)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack16_avx512(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 16 == 0 ? 16 : _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 16 == 0 && out_elempack == 16)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack16_avx512(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 16 == 0 ? 16 : _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 16 == 0 && out_elempack == 16)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack16_avx512(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 16 == 0 ? 16 : _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 16 == 0 && out_elempack == 16)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack16_avx512(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        if (woffset == -233)
        {
            resolve_crop_roi(bottom_blob.shape(), (const int*)reference_blob, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
        }
        else
        {
            resolve_crop_roi(bottom_blob.shape(), reference_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
        }

        if (dims == 1)
        {
            int out_elempack = _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack8_avx(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack8_avx(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        if (woffset == -233)
        {
            resolve_crop_roi(bottom_blob.shape(), (const int*)reference_blob, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
        }
        else
        {
            resolve_crop_roi(bottom_blob.shape(), reference_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
        }

        if (dims == 1)
        {
            int out_elempack = _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);

                    crop_pack4_sse(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);

                        crop_pack4_sse(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    Mat reference_blob_unpacked = reference_blob;
    if (ref_elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(reference_blob, reference_blob_unpacked, 1, opt_pack1);
    }

    std::vector<Mat> bottom_blobs_unpacked(2);
    bottom_blobs_unpacked[0] = bottom_blob_unpacked;
    bottom_blobs_unpacked[1] = reference_blob_unpacked;

    return Crop::forward(bottom_blobs_unpacked, top_blobs, opt);
}